

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *__nptr;
  char *testno;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  char **ppcVar7;
  uint *puVar8;
  char *pcVar9;
  bool bVar10;
  size_t size;
  char *type1_output;
  char *type3_input;
  char *type1_input;
  char *type3_output;
  char buf [1024];
  char logfilename [256];
  char *local_578;
  size_t local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char local_538 [1024];
  char *local_138 [33];
  
  local_548 = (char *)0x0;
  local_550 = (char *)0x0;
  local_558 = (char *)0x0;
  local_540 = (char *)0x0;
  local_570 = 0;
  local_538[0] = '\0';
  if (argc < 2) {
    pcVar9 = "no";
    local_578 = "unknown";
    local_568 = "unknown";
    pcVar5 = "unknown";
  }
  else {
    iVar3 = 1;
    bVar10 = false;
    local_578 = "unknown";
    local_560 = "unknown";
    local_568 = "unknown";
    do {
      pcVar5 = argv[iVar3];
      iVar1 = strcmp("--use-cached-creds",pcVar5);
      if (iVar1 == 0) {
        bVar10 = true;
        iVar1 = iVar3 + 1;
      }
      else {
        iVar1 = strcmp("--helper-protocol",pcVar5);
        if (iVar1 == 0) {
          iVar1 = iVar3 + 1;
          if (iVar1 < argc) {
            local_578 = argv[iVar1];
            iVar1 = iVar3 + 2;
          }
        }
        else {
          iVar1 = strcmp("--username",pcVar5);
          if (iVar1 == 0) {
            iVar1 = iVar3 + 1;
            if (iVar1 < argc) {
              local_568 = argv[iVar1];
              iVar1 = iVar3 + 2;
            }
          }
          else {
            iVar1 = strcmp("--domain",pcVar5);
            if (iVar1 != 0) {
              puts(
                  "Usage: fake_ntlm [option]\n --use-cached-creds\n --helper-protocol [protocol]\n --username [username]\n --domain [domain]"
                  );
              goto LAB_00105526;
            }
            iVar1 = iVar3 + 1;
            if (iVar1 < argc) {
              local_560 = argv[iVar1];
              iVar1 = iVar3 + 2;
            }
          }
        }
      }
      iVar3 = iVar1;
    } while (iVar3 < argc);
    pcVar9 = "no";
    pcVar5 = local_560;
    if (bVar10) {
      pcVar9 = "yes";
    }
  }
  __nptr = getenv("CURL_NTLM_AUTH_TESTNUM");
  if (__nptr == (char *)0x0) {
    pcVar5 = "Test number not specified in CURL_NTLM_AUTH_TESTNUM";
  }
  else {
    testno = (char *)strtol(__nptr,local_138,10);
    sVar4 = strlen(__nptr);
    if ((local_138[0] == __nptr + sVar4) && (0 < (long)testno)) {
      curl_msnprintf((char *)local_138,0x100,"log/fake_ntlm%ld.log",testno);
      serverlogfile = (char *)local_138;
      logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",local_568,local_578,
             pcVar5,pcVar9);
      pcVar5 = getenv("CURL_NTLM_AUTH_SRCDIR");
      if (pcVar5 != (char *)0x0) {
        path = pcVar5;
      }
      pcVar5 = test2file((long)testno);
      pFVar6 = fopen64(pcVar5,"rb");
      if (pFVar6 == (FILE *)0x0) {
LAB_001054e2:
        puVar8 = (uint *)__errno_location();
        uVar2 = *puVar8;
        pcVar9 = strerror(uVar2);
        logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar9);
        logmsg("Error opening file: %s",pcVar5);
        pcVar5 = "Couldn\'t open test file %ld";
LAB_0010551f:
        logmsg(pcVar5,testno);
      }
      else {
        uVar2 = getpart(&local_548,&local_570,"ntlm_auth_type1","input",(FILE *)pFVar6);
        fclose(pFVar6);
        if ((uVar2 == 0) && (local_570 != 0)) {
          pFVar6 = fopen64(pcVar5,"rb");
          if (pFVar6 == (FILE *)0x0) goto LAB_001054e2;
          local_570 = 0;
          local_568 = testno;
          uVar2 = getpart(&local_550,&local_570,"ntlm_auth_type3","input",(FILE *)pFVar6);
          fclose(pFVar6);
          if ((uVar2 == 0) && (local_570 != 0)) {
            pcVar9 = fgets(local_538,0x400,_stdin);
            if (pcVar9 != (char *)0x0) {
              do {
                iVar3 = strcmp(local_538,local_548);
                pcVar9 = local_550;
                if (iVar3 == 0) {
                  pFVar6 = fopen64(pcVar5,"rb");
                  if (pFVar6 == (FILE *)0x0) {
LAB_0010542c:
                    puVar8 = (uint *)__errno_location();
                    uVar2 = *puVar8;
                    pcVar9 = strerror(uVar2);
                    logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar9);
                    logmsg("Error opening file: %s",pcVar5);
                    pcVar5 = "Couldn\'t open test file %ld";
                    testno = local_568;
                    goto LAB_0010551f;
                  }
                  local_570 = 0;
                  uVar2 = getpart(&local_558,&local_570,"ntlm_auth_type1","output",(FILE *)pFVar6);
                  fclose(pFVar6);
                  if ((uVar2 != 0) || (ppcVar7 = &local_558, local_570 == 0)) {
                    pcVar5 = "getpart() type 1 output failed with error: %d";
                    goto LAB_001054ab;
                  }
                }
                else {
                  sVar4 = strlen(local_550);
                  iVar3 = strncmp(local_538,pcVar9,sVar4);
                  if (iVar3 != 0) {
                    curl_mprintf("Unknown request\n");
                    pcVar5 = printable(local_538,(size_t)pcVar9);
                    if (pcVar5 != (char *)0x0) {
                      logmsg("invalid input: \'%s\'\n",pcVar5);
                      free(pcVar5);
                      goto LAB_00105526;
                    }
                    pcVar5 = "OOM formatting invalid input: \'%s\'\n";
                    testno = local_538;
                    goto LAB_0010551f;
                  }
                  pFVar6 = fopen64(pcVar5,"rb");
                  if (pFVar6 == (FILE *)0x0) goto LAB_0010542c;
                  local_570 = 0;
                  uVar2 = getpart(&local_540,&local_570,"ntlm_auth_type3","output",(FILE *)pFVar6);
                  fclose(pFVar6);
                  if ((uVar2 != 0) || (ppcVar7 = &local_540, local_570 == 0)) {
                    pcVar5 = "getpart() type 3 output failed with error: %d";
                    goto LAB_001054ab;
                  }
                }
                curl_mprintf("%s",*ppcVar7);
                fflush(_stdout);
                pcVar9 = fgets(local_538,0x400,_stdin);
              } while (pcVar9 != (char *)0x0);
            }
            logmsg("Exit");
            return 1;
          }
          pcVar5 = "getpart() type 3 input failed with error: %d";
        }
        else {
          pcVar5 = "getpart() type 1 input failed with error: %d";
        }
LAB_001054ab:
        logmsg(pcVar5,(ulong)uVar2);
      }
      goto LAB_00105526;
    }
    pcVar5 = "Test number not valid in CURL_NTLM_AUTH_TESTNUM";
  }
  curl_mfprintf(_stderr,pcVar5);
LAB_00105526:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  char buf[1024];
  char logfilename[256];
  FILE *stream;
  char *filename;
  int error;
  char *type1_input = NULL, *type3_input = NULL;
  char *type1_output = NULL, *type3_output = NULL;
  size_t size = 0;
  long testnum;
  const char *env;
  int arg = 1;
  const char *helper_user = "unknown";
  const char *helper_proto = "unknown";
  const char *helper_domain = "unknown";
  bool use_cached_creds = FALSE;
  char *msgbuf;

  buf[0] = '\0';

  while(argc > arg) {
    if(!strcmp("--use-cached-creds", argv[arg])) {
      use_cached_creds = TRUE;
      arg++;
    }
    else if(!strcmp("--helper-protocol", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_proto = argv[arg++];
    }
    else if(!strcmp("--username", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_user = argv[arg++];
    }
    else if(!strcmp("--domain", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_domain = argv[arg++];
    }
    else {
      puts("Usage: fake_ntlm [option]\n"
           " --use-cached-creds\n"
           " --helper-protocol [protocol]\n"
           " --username [username]\n"
           " --domain [domain]");
      exit(1);
    }
  }

  env = getenv("CURL_NTLM_AUTH_TESTNUM");
  if(env) {
    char *endptr;
    long lnum = strtol(env, &endptr, 10);
    if((endptr != env + strlen(env)) || (lnum < 1L)) {
      fprintf(stderr, "Test number not valid in CURL_NTLM_AUTH_TESTNUM");
      exit(1);
    }
    testnum = lnum;
  }
  else {
    fprintf(stderr, "Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }

  /* logmsg cannot be used until this file name is set */
  snprintf(logfilename, sizeof(logfilename), LOGFILE, testnum);
  serverlogfile = logfilename;

  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",
         helper_user, helper_proto, helper_domain,
         (use_cached_creds) ? "yes" : "no");

  env = getenv("CURL_NTLM_AUTH_SRCDIR");
  if(env) {
    path = env;
  }

  filename = test2file(testnum);
  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    /* get the ntlm_auth input/output */
    error = getpart(&type1_input, &size, "ntlm_auth_type1", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 1 input failed with error: %d", error);
      exit(1);
    }
  }

  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    size = 0;
    error = getpart(&type3_input, &size, "ntlm_auth_type3", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 3 input failed with error: %d", error);
      exit(1);
    }
  }

  while(fgets(buf, sizeof(buf), stdin)) {
    if(strcmp(buf, type1_input) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type1_output, &size, "ntlm_auth_type1", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 1 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type1_output);
      fflush(stdout);
    }
    else if(strncmp(buf, type3_input, strlen(type3_input)) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type3_output, &size, "ntlm_auth_type3", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 3 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type3_output);
      fflush(stdout);
    }
    else {
      printf("Unknown request\n");
      msgbuf = printable(buf, 0);
      if(msgbuf) {
        logmsg("invalid input: '%s'\n", msgbuf);
        free(msgbuf);
      }
      else
        logmsg("OOM formatting invalid input: '%s'\n", buf);
      exit(1);
    }
  }
  logmsg("Exit");
  return 1;
}